

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DependencyManager::CreateDependent
          (DependencyManager *this,CatalogTransaction transaction,DependencyInfo *info)

{
  int iVar1;
  pointer pDVar2;
  undefined4 extraout_var;
  MangledEntryName entry_name;
  DependencyCatalogSet set;
  _Head_base<0UL,_duckdb::DependencyEntry_*,_false> local_b0;
  _Head_base<0UL,_duckdb::DependencyEntry_*,_false> local_a8;
  MangledEntryName local_a0;
  DependencyCatalogSet local_80;
  
  DependencyCatalogSet::DependencyCatalogSet(&local_80,&this->dependents,&(info->subject).entry);
  make_uniq_base<duckdb::DependencyEntry,duckdb::DependencyDependentEntry,duckdb::DuckCatalog&,duckdb::DependencyInfo_const&>
            ((duckdb *)&local_b0,this->catalog,info);
  pDVar2 = unique_ptr<duckdb::DependencyEntry,_std::default_delete<duckdb::DependencyEntry>,_true>::
           operator->((unique_ptr<duckdb::DependencyEntry,_std::default_delete<duckdb::DependencyEntry>,_true>
                       *)&local_b0);
  iVar1 = (*(pDVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x11])(pDVar2);
  ::std::__cxx11::string::string((string *)&local_a0,(string *)CONCAT44(extraout_var,iVar1));
  local_a8._M_head_impl = local_b0._M_head_impl;
  local_b0._M_head_impl = (DependencyEntry *)0x0;
  DependencyCatalogSet::CreateEntry
            (&local_80,transaction,&local_a0,
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
             &local_a8);
  if (local_a8._M_head_impl != (DependencyEntry *)0x0) {
    (*((local_a8._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  ::std::__cxx11::string::~string((string *)&local_a0);
  if (local_b0._M_head_impl != (DependencyEntry *)0x0) {
    (*((local_b0._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  DependencyCatalogSet::~DependencyCatalogSet(&local_80);
  return;
}

Assistant:

void DependencyManager::CreateDependent(CatalogTransaction transaction, const DependencyInfo &info) {
	auto &from = info.subject.entry;

	DependencyCatalogSet set(Dependents(), from);
	auto dep = make_uniq_base<DependencyEntry, DependencyDependentEntry>(catalog, info);
	auto entry_name = dep->EntryMangledName();

	//! Add to the list of object that depend on 'subject'
	set.CreateEntry(transaction, entry_name, std::move(dep));
}